

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::ExitEvalStackScope(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EmitInfo EVar4;
  WasmCompilationException *this_00;
  char16 local_438 [4];
  char16 buf [512];
  
  if ((this->m_evalStack).list.
      super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x842,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
    if (!bVar2) goto LAB_00d6d512;
    *puVar3 = 0;
  }
  else {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  while( true ) {
    do {
      EVar4 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                        (&this->m_evalStack);
      buf._1016_8_ = EVar4;
      if ((ulong)EVar4 >> 0x20 != 8) {
        if (EVar4.type != Limit) {
          JsUtil::
          List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(&(this->m_evalStack).list,(EmitInfo *)(buf + 0x1fc));
          memset(local_438,0,0x400);
          WriteTypeStackToString(this,local_438,0x200);
          this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
          WasmCompilationException::WasmCompilationException
                    (this_00,L"Expected stack to be empty, but has %s",local_438);
          __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                      WasmCompilationException::~WasmCompilationException);
        }
        return;
      }
    } while ((this->m_evalStack).list.
             super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count != 0)
    ;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x847,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
    if (!bVar2) break;
    *puVar3 = 0;
  }
LAB_00d6d512:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void WasmBytecodeGenerator::ExitEvalStackScope(const BlockInfo* blockInfo)
{
    Assert(!m_evalStack.Empty());
    EmitInfo info = m_evalStack.Pop();
    // It is possible to have unconsumed Any type left on the stack, simply remove them
    while (info.type == WasmTypes::Any)
    {
        Assert(!m_evalStack.Empty());
        info = m_evalStack.Pop();
    }
    if (info.type != WasmTypes::Limit)
    {
        // Put info back on stack so we can write it to string
        m_evalStack.Push(info);
        char16 buf[512] = { 0 };
        WriteTypeStackToString(buf, 512);
        throw WasmCompilationException(_u("Expected stack to be empty, but has %s"), buf);
    }
}